

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O3

bool ev3dev::button::process_all(void)

{
  undefined1 *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  undefined1 *puVar9;
  undefined1 auStack_36 [4];
  undefined1 local_32;
  undefined1 local_31;
  
  bVar2 = process((button *)back);
  bVar3 = process((button *)left);
  bVar4 = process((button *)right);
  bVar5 = process((button *)up);
  bVar6 = process((button *)down);
  bVar7 = process((button *)enter);
  puVar9 = &local_31;
  if (!bVar7) {
    puVar9 = &stack0xffffffffffffffd0;
  }
  if (bVar6) {
    puVar9 = &local_32;
  }
  uVar8 = (ulong)bVar4 ^ 3;
  if (bVar3 || bVar2) {
    uVar8 = (ulong)!bVar2;
  }
  puVar1 = auStack_36 + uVar8;
  if (bVar3 || bVar2) {
    puVar9 = puVar1;
  }
  if (bVar5) {
    puVar9 = puVar1;
  }
  if (bVar4) {
    puVar9 = puVar1;
  }
  return puVar9 != &stack0xffffffffffffffd0;
}

Assistant:

bool button::process_all() {
    std::array<bool, 6> changed{{
        back. process(),
            left. process(),
            right.process(),
            up.   process(),
            down. process(),
            enter.process()
    }};
    return std::any_of(changed.begin(), changed.end(), [](bool c){ return c; });
}